

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_extension.cc
# Opt level: O1

void google::protobuf::compiler::javanano::SetVariables
               (FieldDescriptor *descriptor,Params *params,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  Type TVar6;
  JavaType JVar7;
  mapped_type *pmVar8;
  LogMessage *other;
  Descriptor *pDVar9;
  long *plVar10;
  undefined8 *puVar11;
  uint uVar12;
  size_type *psVar13;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint i;
  JavaType extraout_EDX_01;
  JavaType extraout_EDX_02;
  JavaType type;
  uint i_00;
  uint i_01;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *field;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  char *pcVar16;
  string message_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string tag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  key_type local_130;
  key_type local_110;
  key_type local_f0;
  undefined1 local_d0 [60];
  int local_94;
  key_type local_90;
  long *local_70 [2];
  long local_60 [2];
  key_type local_50;
  
  puVar11 = *(undefined8 **)(descriptor + 0x58);
  ToJavaName((string *)local_d0,params,(string *)*puVar11,true,(Descriptor *)puVar11[3],
             (FileDescriptor *)puVar11[2]);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"extends","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_130);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)local_d0);
  field = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    field = extraout_RDX_00;
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    field = extraout_RDX_01;
  }
  UnderscoresToCamelCase_abi_cxx11_(&local_130,(javanano *)descriptor,field);
  RenameJavaKeywords((string *)local_d0,&local_130);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"name","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_110);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  iVar3 = *(int *)(descriptor + 0x4c);
  pcVar16 = "";
  if (iVar3 == 3) {
    pcVar16 = "Repeated";
  }
  local_d0._0_8_ = local_d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"repeated","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_d0);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar16);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  TVar6 = FieldDescriptor::type(descriptor);
  if (TVar6 - TYPE_DOUBLE < 0x12) {
    pcVar16 = &DAT_0039c3c0 + *(int *)(&DAT_0039c3c0 + (ulong)(TVar6 - TYPE_DOUBLE) * 4);
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_extension.cc"
               ,0x4a);
    other = internal::LogMessage::operator<<((LogMessage *)local_d0,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_130,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_d0);
    pcVar16 = (char *)0x0;
  }
  local_d0._0_8_ = local_d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"type","");
  local_94 = iVar3;
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_d0);
  pcVar4 = (char *)pmVar8->_M_string_length;
  strlen(pcVar16);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,pcVar4,(ulong)pcVar16);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  TVar6 = FieldDescriptor::type(descriptor);
  JVar7 = GetJavaType(TVar6);
  iVar3 = *(int *)(descriptor + 0x38);
  bVar5 = FieldDescriptor::is_packed(descriptor);
  uVar12 = 2;
  i = extraout_EDX;
  if (!bVar5) {
    TVar6 = FieldDescriptor::type(descriptor);
    uVar12 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar6 * 4);
    i = extraout_EDX_00;
  }
  SimpleItoa_abi_cxx11_((string *)local_d0,(protobuf *)(ulong)(iVar3 << 3 | uVar12),i);
  paVar1 = &local_130.field_2;
  local_130._M_dataplus._M_p = (pointer)paVar1;
  if (JVar7 == JAVATYPE_MESSAGE) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"ext_type","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_130);
    iVar3 = local_94;
    std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0x39c1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    pDVar9 = FieldDescriptor::message_type(descriptor);
    ToJavaName(&local_130,params,*(string **)pDVar9,true,*(Descriptor **)(pDVar9 + 0x18),
               *(FileDescriptor **)(pDVar9 + 0x10));
    if (iVar3 == 3) {
      std::__cxx11::string::append((char *)&local_130);
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"class","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::_M_assign((string *)pmVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"tag_params","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_110);
    std::__cxx11::string::_M_assign((string *)pmVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
LAB_002a8f54:
    uVar14 = local_130.field_2._M_allocated_capacity;
    _Var15._M_p = local_130._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == paVar1) goto LAB_002a8f6b;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"ext_type","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_130);
    std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0x39c1c1);
    type = extraout_EDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      type = extraout_EDX_02;
    }
    if (local_94 != 3) {
      BoxedPrimitiveTypeName_abi_cxx11_(&local_130,(javanano *)(ulong)JVar7,type);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"class","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_110);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      local_130._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"tag_params","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_130);
      std::__cxx11::string::_M_assign((string *)pmVar8);
      goto LAB_002a8f54;
    }
    PrimitiveTypeName_abi_cxx11_(&local_110,(javanano *)(ulong)JVar7,type);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_130.field_2._M_allocated_capacity = *psVar13;
      local_130.field_2._8_4_ = (undefined4)plVar10[3];
      local_130.field_2._12_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
      local_130._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar13;
      local_130._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_130._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    paVar2 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"class","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_f0);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((*(int *)(descriptor + 0x4c) == 3) &&
       (TVar6 = FieldDescriptor::type(descriptor), TVar6 - TYPE_UINT32 < 0xfffffffc)) {
      if (*(char *)(*(long *)(descriptor + 0x80) + 0x6c) == '\x01') {
        iVar3 = *(int *)(descriptor + 0x38);
        TVar6 = FieldDescriptor::type(descriptor);
        SimpleItoa_abi_cxx11_
                  (&local_130,
                   (protobuf *)
                   (ulong)(iVar3 << 3 |
                          *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                                   (ulong)TVar6 * 4)),i_01);
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,local_d0._0_8_,(char *)(local_d0._8_8_ + local_d0._0_8_));
        std::__cxx11::string::append((char *)local_70);
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)local_70,(ulong)local_130._M_dataplus._M_p);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        psVar13 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_90.field_2._M_allocated_capacity = *psVar13;
          local_90.field_2._8_8_ = plVar10[3];
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar13;
          local_90._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_90._M_string_length = plVar10[1];
        *plVar10 = (long)psVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
        psVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_f0.field_2._M_allocated_capacity = *psVar13;
          local_f0.field_2._8_8_ = puVar11[3];
          local_f0._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar13;
          local_f0._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_f0._M_string_length = puVar11[1];
        *puVar11 = psVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,local_d0._0_8_);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        psVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_110.field_2._M_allocated_capacity = *psVar13;
          local_110.field_2._8_8_ = puVar11[3];
        }
        else {
          local_110.field_2._M_allocated_capacity = *psVar13;
          local_110._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_110._M_string_length = puVar11[1];
        *puVar11 = psVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"tag_params","");
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](variables,&local_50);
      }
      else {
        SimpleItoa_abi_cxx11_
                  (&local_130,(protobuf *)(ulong)(*(int *)(descriptor + 0x38) * 8 + 2),i_00);
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,local_d0._0_8_,(char *)(local_d0._8_8_ + local_d0._0_8_));
        std::__cxx11::string::append((char *)local_70);
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_70,local_d0._0_8_);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        psVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_90.field_2._M_allocated_capacity = *psVar13;
          local_90.field_2._8_8_ = puVar11[3];
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar13;
          local_90._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_90._M_string_length = puVar11[1];
        *puVar11 = psVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_90);
        psVar13 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_f0.field_2._M_allocated_capacity = *psVar13;
          local_f0.field_2._8_8_ = plVar10[3];
          local_f0._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar13;
          local_f0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_f0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_f0,(ulong)local_130._M_dataplus._M_p);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        psVar13 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_110.field_2._M_allocated_capacity = *psVar13;
          local_110.field_2._8_8_ = plVar10[3];
        }
        else {
          local_110.field_2._M_allocated_capacity = *psVar13;
          local_110._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_110._M_string_length = plVar10[1];
        *plVar10 = (long)psVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"tag_params","");
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](variables,&local_50);
      }
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      uVar14 = local_130.field_2._M_allocated_capacity;
      _Var15._M_p = local_130._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p == &local_130.field_2) goto LAB_002a8f6b;
    }
    else {
      local_f0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_d0._0_8_,(char *)(local_d0._8_8_ + local_d0._0_8_));
      std::__cxx11::string::append((char *)&local_f0);
      plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_f0,local_d0._0_8_);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      psVar13 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_110.field_2._M_allocated_capacity = *psVar13;
        local_110.field_2._8_8_ = plVar10[3];
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar13;
        local_110._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_110._M_string_length = plVar10[1];
      *plVar10 = (long)psVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
      psVar13 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_130.field_2._M_allocated_capacity = *psVar13;
        local_130.field_2._8_4_ = (undefined4)plVar10[3];
        local_130.field_2._12_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
        local_130._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar13;
        local_130._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_130._M_string_length = plVar10[1];
      *plVar10 = (long)psVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"tag_params","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_90);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      uVar14 = local_f0.field_2._M_allocated_capacity;
      _Var15._M_p = local_f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p == paVar2) goto LAB_002a8f6b;
    }
  }
  operator_delete(_Var15._M_p,uVar14 + 1);
LAB_002a8f6b:
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  return;
}

Assistant:

void SetVariables(const FieldDescriptor* descriptor, const Params params,
                  map<string, string>* variables) {
  (*variables)["extends"] = ClassName(params, descriptor->containing_type());
  (*variables)["name"] = RenameJavaKeywords(UnderscoresToCamelCase(descriptor));
  bool repeated = descriptor->is_repeated();
  (*variables)["repeated"] = repeated ? "Repeated" : "";
  (*variables)["type"] = GetTypeConstantName(descriptor->type());
  JavaType java_type = GetJavaType(descriptor->type());
  string tag = SimpleItoa(WireFormat::MakeTag(descriptor));
  if (java_type == JAVATYPE_MESSAGE) {
    (*variables)["ext_type"] = "MessageTyped";
    string message_type = ClassName(params, descriptor->message_type());
    if (repeated) {
      message_type += "[]";
    }
    (*variables)["class"] = message_type;
    // For message typed extensions, tags_params contains a single tag
    // for both singular and repeated cases.
    (*variables)["tag_params"] = tag;
  } else {
    (*variables)["ext_type"] = "PrimitiveTyped";
    if (!repeated) {
      (*variables)["class"] = BoxedPrimitiveTypeName(java_type);
      (*variables)["tag_params"] = tag;
    } else {
      (*variables)["class"] = PrimitiveTypeName(java_type) + "[]";
      if (!descriptor->is_packable()) {
        // Non-packable: nonPackedTag == tag, packedTag == 0
        (*variables)["tag_params"] = tag + ", " + tag + ", 0";
      } else if (descriptor->options().packed()) {
        // Packable and packed: tag == packedTag
        string non_packed_tag = SimpleItoa(WireFormatLite::MakeTag(
            descriptor->number(),
            WireFormat::WireTypeForFieldType(descriptor->type())));
        (*variables)["tag_params"] = tag + ", " + non_packed_tag + ", " + tag;
      } else {
        // Packable and not packed: tag == nonPackedTag
        string packed_tag = SimpleItoa(WireFormatLite::MakeTag(
            descriptor->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
        (*variables)["tag_params"] = tag + ", " + tag + ", " + packed_tag;
      }
    }
  }
}